

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_finite_automaton.cpp
# Opt level: O3

int Omega_h::step(FiniteAutomaton *fa,int state,int symbol)

{
  int iVar1;
  ConstRef pvVar2;
  undefined8 uVar3;
  char *pcVar4;
  
  if (state < 0) {
    pcVar4 = "0 <= state";
    uVar3 = 0x47;
  }
  else {
    iVar1 = get_nrows<int>(&fa->table);
    if (state < iVar1) {
      if (symbol < 0) {
        pcVar4 = "0 <= symbol";
        uVar3 = 0x49;
      }
      else {
        if (symbol < (fa->table).ncols) {
          pvVar2 = at<int>(&fa->table,state,symbol);
          return *pvVar2;
        }
        pcVar4 = "symbol < get_ncols(fa.table)";
        uVar3 = 0x4b;
      }
    }
    else {
      pcVar4 = "state < get_nstates(fa)";
      uVar3 = 0x48;
    }
  }
  fail("assertion %s failed at %s +%d\n",pcVar4,
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_finite_automaton.cpp"
       ,uVar3);
}

Assistant:

int step(FiniteAutomaton const& fa, int state, int symbol) {
  OMEGA_H_CHECK(0 <= state);
  OMEGA_H_CHECK(state < get_nstates(fa));
  OMEGA_H_CHECK(0 <= symbol);
  OMEGA_H_CHECK(
      symbol < get_ncols(fa.table));  // allow getting epsilon transitions
  return at(fa.table, state, symbol);
}